

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticquad.cpp
# Opt level: O3

void pzgeom::TPZQuadraticQuad::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  TPZGeoNode *pTVar4;
  TPZGeoEl **ppTVar5;
  TPZGeoEl *pTVar6;
  long lVar7;
  long lVar8;
  int i_1;
  int iVar9;
  int64_t index;
  TPZManVector<long,_4> nodeindexes;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> co_1;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  int64_t local_160;
  double local_158;
  TPZVec<long> local_150;
  long local_130 [4];
  TPZManVector<double,_3> local_110;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  TPZManVector<double,_3>::TPZManVector(&local_110,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZVec<long>::TPZVec(&local_150,0);
  local_150.fStore = local_130;
  local_150._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01878bc8;
  local_150.fNElements = 4;
  local_150.fNAlloc = 0;
  pdVar1 = size->fStore;
  pdVar2 = lowercorner->fStore;
  lVar8 = 0;
  do {
    local_a0.super_TPZVec<double>.fStore[lVar8] = pdVar1[lVar8] / 3.0;
    local_68.super_TPZVec<double>.fStore[lVar8] = pdVar1[lVar8] * 0.5 + pdVar2[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    pztopology::TPZQuadrilateral::ParametricDomainNodeCoord
              ((int)lVar8,&local_110.super_TPZVec<double>);
    local_d8.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_3>::Resize(&local_110,3,(double *)&local_d8);
    lVar7 = 0;
    do {
      local_158 = local_a0.super_TPZVec<double>.fStore[lVar7] *
                  local_110.super_TPZVec<double>.fStore[lVar7] +
                  local_68.super_TPZVec<double>.fStore[lVar7];
      iVar3 = rand();
      local_110.super_TPZVec<double>.fStore[lVar7] =
           ((double)iVar3 * 0.2) / 2147483647.0 + local_158 + -0.1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    local_150.fStore[lVar8] = (long)iVar3;
    pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
    TPZGeoNode::Initialize(pTVar4,&local_110.super_TPZVec<double>,gmesh);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,3,&local_150,(ulong)(uint)matid,&local_160,1);
  ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,local_160);
  pTVar6 = *ppTVar5;
  iVar3 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
  if (0 < iVar3) {
    iVar9 = 0;
    do {
      (**(code **)(*(long *)pTVar6 + 0x180))(pTVar6,iVar9);
      iVar9 = iVar9 + 1;
    } while (iVar3 != iVar9);
  }
  pTVar6 = TPZChangeEl::ChangeToQuadratic(gmesh,local_160);
  iVar3 = (**(code **)(*(long *)pTVar6 + 0x98))(pTVar6);
  while( true ) {
    iVar9 = (**(code **)(*(long *)pTVar6 + 0x90))(pTVar6);
    if (iVar9 <= iVar3) break;
    TPZManVector<double,_3>::TPZManVector(&local_d8,3);
    pTVar4 = TPZGeoEl::NodePtr(pTVar6,iVar3);
    TPZGeoNode::GetCoordinates(pTVar4,&local_d8.super_TPZVec<double>);
    lVar8 = 0;
    do {
      iVar9 = rand();
      local_d8.super_TPZVec<double>.fStore[lVar8] =
           ((double)iVar9 * 0.2) / 2147483647.0 + -0.1 + local_d8.super_TPZVec<double>.fStore[lVar8]
      ;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    pTVar4 = TPZGeoEl::NodePtr(pTVar6,iVar3);
    TPZGeoNode::SetCoord(pTVar4,&local_d8.super_TPZVec<double>);
    TPZManVector<double,_3>::~TPZManVector(&local_d8);
    iVar3 = iVar3 + 1;
  }
  if (local_150.fStore != local_130) {
    local_150.fNAlloc = 0;
    local_150._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_150.fStore != (long *)0x0) {
      operator_delete__(local_150.fStore);
    }
  }
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_110);
  return;
}

Assistant:

void TPZQuadraticQuad::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    TPZManVector<REAL,3> co(3),shift(3),scale(3);
    TPZManVector<int64_t,4> nodeindexes(NCornerNodes);
    for (int i=0; i<3; i++) {
        scale[i] = size[i]/3.;
        shift[i] = size[i]/2.+lowercorner[i];
    }
    
    for (int i=0; i<NCornerNodes; i++) {
        ParametricDomainNodeCoord(i, co);
        co.Resize(3,0.);
        for (int j=0; j<3; j++) {
            co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
    }
    int64_t index;
    gmesh.CreateGeoElement(EQuadrilateral, nodeindexes, matid, index);
    TPZGeoEl *gel = gmesh.Element(index);
    int nsides = gel->NSides();
    for (int is=0; is<nsides; is++) {
        gel->SetSideDefined(is);
    }
    gel = TPZChangeEl::ChangeToQuadratic(&gmesh, index);
    for (int node = gel->NCornerNodes(); node < gel->NNodes(); node++) {
        TPZManVector<REAL,3> co(3);
        gel->NodePtr(node)->GetCoordinates(co);
        for (int i=0; i<3; i++) {
            co[i] += (0.2*rand())/RAND_MAX - 0.1;
        }
        gel->NodePtr(node)->SetCoord(co);
    }
}